

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

void __thiscall
bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>::PushBack
          (MRUQueue<bssl::DTLSSentRecord,_32UL> *this,DTLSSentRecord t)

{
  DTLSSentRecord *pDVar1;
  
  if (0x1f < (this->storage_).size_) {
    pDVar1 = operator[](this,0);
    (pDVar1->number).combined_ = t.number.combined_;
    pDVar1->first_msg = t.first_msg;
    pDVar1->last_msg = t.last_msg;
    *(undefined2 *)&pDVar1->field_0xa = t._10_2_;
    pDVar1->first_msg_start = t.first_msg_start;
    pDVar1->last_msg_end = t.last_msg_end;
    this->start_ = this->start_ + 1 & 0x1f;
    return;
  }
  if (this->start_ == '\0') {
    InplaceVector<bssl::DTLSSentRecord,_32UL>::PushBack(&this->storage_,t);
    return;
  }
  __assert_fail("start_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/internal.h"
                ,100,
                "void bssl::MRUQueue<bssl::DTLSSentRecord, 32>::PushBack(T) [T = bssl::DTLSSentRecord, N = 32]"
               );
}

Assistant:

void PushBack(T t) {
    if (storage_.size() < N) {
      assert(start_ == 0);
      storage_.PushBack(std::move(t));
    } else {
      (*this)[0] = std::move(t);
      start_ = (start_ + 1) % N;
    }
  }